

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int libssh2_userauth_publickey_sk
              (LIBSSH2_SESSION *session,char *username,size_t username_len,uchar *publickeydata,
              size_t publickeydata_len,char *privatekeydata,size_t privatekeydata_len,
              char *passphrase,
              _func_int_LIBSSH2_SESSION_ptr_LIBSSH2_SK_SIG_INFO_ptr_uchar_ptr_size_t_int_uint8_t_char_ptr_uchar_ptr_size_t_void_ptr_ptr
              *sign_callback,void **abstract)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  char *ed25519;
  char *ecdsa;
  void *sign_abstract;
  LIBSSH2_PRIVKEY_SK sk_info;
  size_t pubkeydata_len;
  uchar *pubkeydata;
  size_t tmp_publickeydata_len;
  uchar *tmp_publickeydata;
  size_t tmp_method_len;
  uchar *tmp_method;
  char *pcStack_60;
  int rc;
  char *privatekeydata_local;
  size_t publickeydata_len_local;
  uchar *publickeydata_local;
  size_t username_len_local;
  char *username_local;
  LIBSSH2_SESSION *session_local;
  
  tmp_method._4_4_ = 0;
  tmp_method_len = 0;
  tmp_publickeydata = (uchar *)0x0;
  tmp_publickeydata_len = 0;
  pubkeydata = (uchar *)0x0;
  pubkeydata_len = 0;
  sk_info.orig_abstract = (void **)0x0;
  pcStack_60 = privatekeydata;
  privatekeydata_local = (char *)publickeydata_len;
  publickeydata_len_local = (size_t)publickeydata;
  publickeydata_local = (uchar *)username_len;
  username_len_local = (size_t)username;
  username_local = (char *)session;
  memset(&sign_abstract,0,0x30);
  ecdsa = (char *)&sign_abstract;
  sk_info.handle_len = (size_t)sign_callback;
  sk_info.sign_callback =
       (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_SK_SIG_INFO_ptr_uchar_ptr_size_t_int_uint8_t_char_ptr_uchar_ptr_size_t_void_ptr_ptr
        *)abstract;
  if ((privatekeydata_len == 0) || (pcStack_60 == (char *)0x0)) {
    session_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)username_local,-0x10,
                        "Invalid data in public and private key.");
  }
  else {
    iVar2 = _libssh2_sk_pub_keyfilememory
                      ((LIBSSH2_SESSION *)username_local,(uchar **)&tmp_method_len,
                       (size_t *)&tmp_publickeydata,(uchar **)&tmp_publickeydata_len,
                       (size_t *)&pubkeydata,(int *)&sign_abstract,
                       (uchar *)((long)&sign_abstract + 4),(char **)&sk_info,
                       (uchar **)&sk_info.application,(size_t *)&sk_info.key_handle,pcStack_60,
                       privatekeydata_len,passphrase);
    if (iVar2 == 0) {
      if ((privatekeydata_local == (char *)0x0) || (publickeydata_len_local == 0)) {
        *(size_t *)(username_local + 0x11a48) = tmp_method_len;
        *(uchar **)(username_local + 0x11a50) = tmp_publickeydata;
        sk_info.orig_abstract = (void **)pubkeydata;
        pubkeydata_len = tmp_publickeydata_len;
      }
      else {
        if (tmp_method_len != 0) {
          (**(code **)(username_local + 0x18))(tmp_method_len,username_local);
        }
        sVar1 = publickeydata_len_local;
        sVar3 = strlen("sk-ecdsa-sha2-nistp256-cert-v01@openssh.com");
        iVar2 = strncmp((char *)sVar1,"sk-ecdsa-sha2-nistp256-cert-v01@openssh.com",sVar3);
        sVar1 = publickeydata_len_local;
        if (iVar2 == 0) {
          sVar3 = strlen("sk-ecdsa-sha2-nistp256-cert-v01@openssh.com");
          *(size_t *)(username_local + 0x11a50) = sVar3;
          uVar4 = (**(code **)(username_local + 8))
                            (*(undefined8 *)(username_local + 0x11a50),username_local);
          *(undefined8 *)(username_local + 0x11a48) = uVar4;
          memcpy(*(void **)(username_local + 0x11a48),"sk-ecdsa-sha2-nistp256-cert-v01@openssh.com",
                 *(size_t *)(username_local + 0x11a50));
        }
        else {
          sVar3 = strlen("sk-ssh-ed25519-cert-v01@openssh.com");
          iVar2 = strncmp((char *)sVar1,"sk-ssh-ed25519-cert-v01@openssh.com",sVar3);
          if (iVar2 == 0) {
            sVar3 = strlen("sk-ssh-ed25519-cert-v01@openssh.com");
            *(size_t *)(username_local + 0x11a50) = sVar3;
            uVar4 = (**(code **)(username_local + 8))
                              (*(undefined8 *)(username_local + 0x11a50),username_local);
            *(undefined8 *)(username_local + 0x11a48) = uVar4;
            memcpy(*(void **)(username_local + 0x11a48),"sk-ssh-ed25519-cert-v01@openssh.com",
                   *(size_t *)(username_local + 0x11a50));
          }
        }
        tmp_method._4_4_ =
             memory_read_publickey
                       ((LIBSSH2_SESSION *)username_local,(uchar **)(username_local + 0x11a48),
                        (size_t *)(username_local + 0x11a50),(uchar **)&pubkeydata_len,
                        (size_t *)&sk_info.orig_abstract,(char *)publickeydata_len_local,
                        (size_t)privatekeydata_local);
      }
      if (tmp_method._4_4_ == 0) {
        tmp_method._4_4_ =
             _libssh2_userauth_publickey
                       ((LIBSSH2_SESSION *)username_local,(char *)username_len_local,
                        (size_t)publickeydata_local,(uchar *)pubkeydata_len,
                        (size_t)sk_info.orig_abstract,libssh2_sign_sk,&ecdsa);
        while (tmp_method._4_4_ == -0x25) {
          tmp_method._4_4_ =
               _libssh2_userauth_publickey
                         ((LIBSSH2_SESSION *)username_local,(char *)username_len_local,
                          (size_t)publickeydata_local,(uchar *)pubkeydata_len,
                          (size_t)sk_info.orig_abstract,libssh2_sign_sk,&ecdsa);
        }
      }
      if (tmp_publickeydata_len != 0) {
        (**(code **)(username_local + 0x18))(tmp_publickeydata_len,username_local);
      }
      if (sk_info._0_8_ != 0) {
        (**(code **)(username_local + 0x18))(sk_info._0_8_,username_local);
      }
      session_local._4_4_ = tmp_method._4_4_;
    }
    else {
      session_local._4_4_ =
           _libssh2_error((LIBSSH2_SESSION *)username_local,-0x10,
                          "Unable to extract public key from private key.");
    }
  }
  return session_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_publickey_sk(LIBSSH2_SESSION *session,
                              const char *username,
                              size_t username_len,
                              const unsigned char *publickeydata,
                              size_t publickeydata_len,
                              const char *privatekeydata,
                              size_t privatekeydata_len,
                              const char *passphrase,
                              LIBSSH2_USERAUTH_SK_SIGN_FUNC
                                  ((*sign_callback)),
                              void **abstract)
{
    int rc = LIBSSH2_ERROR_NONE;

    unsigned char *tmp_method = NULL;
    size_t tmp_method_len = 0;

    unsigned char *tmp_publickeydata = NULL;
    size_t tmp_publickeydata_len = 0;

    unsigned char *pubkeydata = NULL;
    size_t pubkeydata_len = 0;

    LIBSSH2_PRIVKEY_SK sk_info = { 0 };
    void *sign_abstract = &sk_info;

    sk_info.sign_callback = sign_callback;
    sk_info.orig_abstract = abstract;

    if(privatekeydata_len && privatekeydata) {

        if(_libssh2_sk_pub_keyfilememory(session,
                                         &tmp_method,
                                         &tmp_method_len,
                                         &tmp_publickeydata,
                                         &tmp_publickeydata_len,
                                         &(sk_info.algorithm),
                                         &(sk_info.flags),
                                         &(sk_info.application),
                                         &(sk_info.key_handle),
                                         &(sk_info.handle_len),
                                         privatekeydata, privatekeydata_len,
                                         passphrase)) {
            return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                                  "Unable to extract public key "
                                  "from private key.");
        }
        else if(publickeydata_len == 0 || !publickeydata) {
            session->userauth_pblc_method = tmp_method;
            session->userauth_pblc_method_len = tmp_method_len;

            pubkeydata_len = tmp_publickeydata_len;
            pubkeydata = tmp_publickeydata;
        }
        else {
            const char *ecdsa = "sk-ecdsa-sha2-nistp256-cert-v01@openssh.com";
            const char *ed25519 = "sk-ssh-ed25519-cert-v01@openssh.com";

            if(tmp_method) {
                LIBSSH2_FREE(session, tmp_method);
            }

            if(!strncmp((char *)publickeydata, ecdsa, strlen(ecdsa))) {
                session->userauth_pblc_method_len = strlen(ecdsa);
                session->userauth_pblc_method =
                    LIBSSH2_ALLOC(session, session->userauth_pblc_method_len);

                memcpy(session->userauth_pblc_method, ecdsa,
                       session->userauth_pblc_method_len);
            }
            else if(!strncmp((char *)publickeydata, ed25519,
                             strlen(ed25519))) {
                session->userauth_pblc_method_len = strlen(ed25519);
                session->userauth_pblc_method =
                    LIBSSH2_ALLOC(session, session->userauth_pblc_method_len);

                memcpy(session->userauth_pblc_method, ed25519,
                       session->userauth_pblc_method_len);
            }

            rc = memory_read_publickey(session,
                                       &session->userauth_pblc_method,
                                       &session->userauth_pblc_method_len,
                                       &pubkeydata, &pubkeydata_len,
                                       (char *)publickeydata,
                                       publickeydata_len);
        }
    }
    else {
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid data in public and private key.");
    }

    if(rc == LIBSSH2_ERROR_NONE) {
        rc = _libssh2_userauth_publickey(session, username, username_len,
                                         pubkeydata, pubkeydata_len,
                                         libssh2_sign_sk, &sign_abstract);

        while(rc == LIBSSH2_ERROR_EAGAIN) {
            rc = _libssh2_userauth_publickey(session, username, username_len,
                                             pubkeydata, pubkeydata_len,
                                             libssh2_sign_sk, &sign_abstract);
        }
    }

    if(tmp_publickeydata)
        LIBSSH2_FREE(session, tmp_publickeydata);

    if(sk_info.application) {
        LIBSSH2_FREE(session, (void *)sk_info.application);
    }

    return rc;
}